

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void run_xor_test(void)

{
  short sVar1;
  _Bool _Var2;
  uint16_t uVar3;
  int iVar4;
  array_container_t *src_1;
  array_container_t *src_1_00;
  array_container_t *src_1_01;
  array_container_t *arr;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  bitset_container_t *bitset;
  run_container_t *src_1_02;
  run_container_t *src_2_02;
  run_container_t *src_2_03;
  run_container_t *src_1_03;
  array_container_t *src_1_04;
  uint uVar5;
  ulong uVar6;
  int x;
  int iVar7;
  unsigned_long a;
  container_t *C;
  
  src_1 = array_container_create();
  src_1_00 = array_container_create();
  src_1_01 = array_container_create();
  arr = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  bitset = bitset_container_create();
  src_1_02 = run_container_create();
  src_2_02 = run_container_create();
  src_2_03 = run_container_create();
  src_1_03 = run_container_create();
  for (uVar5 = 0; uVar5 != 0x10000; uVar5 = uVar5 + 1) {
    uVar3 = (uint16_t)uVar5;
    if ((ushort)((short)((uVar5 & 0xffff) / 5) * -5 + uVar3) < 3) {
      array_container_add(src_1,uVar3);
      bitset_container_set(src_2,uVar3);
      run_container_add(src_1_02,uVar3);
    }
  }
  for (uVar5 = 0; uVar5 != 0x10000; uVar5 = uVar5 + 1) {
    uVar3 = (uint16_t)uVar5;
    if ((ushort)((short)((uVar5 & 0xffff) / 0x3e) * -0x3e + uVar3) < 0x25) {
      array_container_add(src_1_00,uVar3);
      bitset_container_set(src_2_00,uVar3);
      run_container_add(src_2_02,uVar3);
    }
  }
  uVar5 = 0;
  while( true ) {
    uVar3 = (uint16_t)uVar5;
    if (uVar5 == 0x10000) break;
    if ((ushort)((short)((uVar5 & 0xffff) / 0x3e) * -0x3e + uVar3) < 0x25 !=
        (ushort)((short)((uVar5 & 0xffff) / 5) * -5 + uVar3) < 3) {
      array_container_add(arr,uVar3);
      bitset_container_set(bitset,uVar3);
    }
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  while( true ) {
    uVar3 = (uint16_t)uVar5;
    if (uVar5 == 0x10000) break;
    sVar1 = (short)((uVar5 & 0xffff) / 5) * -5;
    if (((ushort)(uVar3 + sVar1) < 2) || ((10000 < uVar5 && ((uint16_t)(sVar1 + uVar3) == 2)))) {
      array_container_add(src_1_01,uVar3);
      bitset_container_set(src_2_01,uVar3);
      run_container_add(src_2_03,uVar3);
    }
    uVar5 = uVar5 + 1;
  }
  uVar6 = 1;
  for (iVar7 = 0; iVar7 != 0x10000; iVar7 = iVar7 + 1) {
    if ((uVar6 & 3) != 0) {
      run_container_add(src_1_03,(uint16_t)iVar7);
    }
    uVar6 = (ulong)((int)uVar6 * 0xd68 + 0x1a85) % 0x26f5;
  }
  a = (unsigned_long)arr->cardinality;
  C = (container_t *)0x0;
  _Var2 = run_bitset_container_xor(src_1_02,src_2,&C);
  _assert_true((ulong)!_Var2,"run_bitset_container_xor(R1, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x23d);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x23e);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  iVar7 = array_run_container_xor(src_1,src_1_02,&C);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x242);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x243);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  iVar7 = run_run_container_xor(src_1_02,src_1_02,&C);
  _assert_int_equal(3,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x249);
  iVar7 = run_container_cardinality((run_container_t *)C);
  _assert_int_equal(0,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x24a);
  run_container_free((run_container_t *)C);
  C = (container_t *)0x0;
  _Var2 = run_bitset_container_xor(src_1_02,src_2_01,&C);
  _assert_true((ulong)!_Var2,"run_bitset_container_xor(R1, B3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x24e);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x24f);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  iVar7 = array_run_container_xor(src_1_01,src_1_02,&C);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x253);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x254);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  iVar7 = run_run_container_xor(src_1_02,src_2_03,&C);
  _assert_int_equal(2,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,600);
  _assert_int_equal(2000,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x259);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  _Var2 = run_bitset_container_xor(src_1_02,src_2_00,&C);
  _assert_true((ulong)_Var2,"run_bitset_container_xor(R1, B2, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x25d);
  _assert_int_equal(a,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x25e);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  iVar7 = array_run_container_xor(src_1_00,src_1_02,&C);
  _assert_int_equal(1,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x263);
  _assert_int_equal(a,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x264);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  src_1_04 = array_container_create();
  for (iVar7 = -10; iVar7 != 0; iVar7 = iVar7 + 1) {
    array_container_add(src_1_04,(short)iVar7 + 0x3f2);
  }
  iVar7 = array_run_container_xor(src_1_04,src_2_02,&C);
  _assert_int_equal(3,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x26c);
  iVar7 = run_container_cardinality((run_container_t *)C);
  _assert_int_equal(0x98bd,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x26d);
  run_container_free((run_container_t *)C);
  C = (container_t *)0x0;
  iVar7 = run_run_container_xor(src_1_02,src_2_02,&C);
  _assert_int_equal(1,(long)iVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x271);
  _assert_int_equal(a,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x272);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  _Var2 = run_bitset_container_xor(src_1_03,src_2_01,&C);
  _assert_true((ulong)_Var2,"run_bitset_container_xor(R4, B3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x276);
  iVar7 = *C;
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  iVar4 = array_run_container_xor(src_1_01,src_1_03,&C);
  _assert_int_equal(1,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x27d);
  _assert_int_equal((long)iVar7,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x27f);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  iVar4 = run_run_container_xor(src_1_03,src_2_03,&C);
  _assert_int_equal(1,(long)iVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x283);
  _assert_int_equal((long)iVar7,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x284);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  array_container_free(src_1);
  array_container_free(src_1_00);
  array_container_free(src_1_01);
  array_container_free(arr);
  array_container_free(src_1_04);
  bitset_container_free(src_2);
  bitset_container_free(src_2_00);
  bitset_container_free(src_2_01);
  bitset_container_free(bitset);
  run_container_free(src_1_02);
  run_container_free(src_2_02);
  run_container_free(src_2_03);
  run_container_free(src_1_03);
  return;
}

Assistant:

DEFINE_TEST(run_xor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    assert_false(run_bitset_container_xor(R1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A1, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE, run_run_container_xor(R1, R1, &C));
    assert_int_equal(0, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_false(run_bitset_container_xor(R1, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A3, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, run_run_container_xor(R1, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R1, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A2, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_t* A_small = array_container_create();
    for (int i = 1000; i < 1010; ++i) array_container_add(A_small, i);

    assert_int_equal(RUN_CONTAINER_TYPE,
                     array_run_container_xor(A_small, R2, &C));
    assert_int_equal(0x98bd, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R1, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R4, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A3, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R4, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}